

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.cpp
# Opt level: O2

int lua_resume(lua_State *L,int nargs)

{
  unsigned_short uVar1;
  uint errcode;
  char *msg;
  
  if ((L->status == '\x01') || ((L->status == '\0' && (L->ci == L->base_ci)))) {
    if (L->nCcalls < 200) {
      uVar1 = L->nCcalls + 1;
      L->nCcalls = uVar1;
      L->baseCcalls = uVar1;
      errcode = luaD_rawrunprotected(L,resume,L->top + -(long)nargs);
      if (errcode == 0) {
        errcode = (uint)L->status;
      }
      else {
        L->status = (lu_byte)errcode;
        luaD_seterrorobj(L,errcode,L->top);
        L->ci->top = L->top;
      }
      L->nCcalls = L->nCcalls - 1;
      return errcode;
    }
    msg = "C stack overflow";
  }
  else {
    msg = "cannot resume non-suspended coroutine";
  }
  resume_error(L,msg);
  return 2;
}

Assistant:

LUA_API int lua_resume (lua_State *L, int nargs) {
  int status;
  lua_lock(L);
  if (L->status != LUA_YIELD && (L->status != 0 || L->ci != L->base_ci))
      return resume_error(L, "cannot resume non-suspended coroutine");
  if (L->nCcalls >= LUAI_MAXCCALLS)
    return resume_error(L, "C stack overflow");
  luai_userstateresume(L, nargs);
  lua_assert(L->errfunc == 0);
  L->baseCcalls = ++L->nCcalls;
  status = luaD_rawrunprotected(L, resume, L->top - nargs);
  if (status != 0) {  /* error? */
    L->status = cast_byte(status);  /* mark thread as `dead' */
    luaD_seterrorobj(L, status, L->top);
    L->ci->top = L->top;
  }
  else {
    lua_assert(L->nCcalls == L->baseCcalls);
    status = L->status;
  }
  --L->nCcalls;
  lua_unlock(L);
  return status;
}